

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O1

FMStructDescList combineCpDpFormats(FMStructDescList top,FMStructDescList cp,FMStructDescList dp)

{
  uint uVar1;
  char **ppcVar2;
  void *__ptr;
  FMStructDescList p_Var3;
  char *pcVar4;
  undefined8 uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  
  __ptr = (void *)FMcopy_struct_list();
  uVar9 = 0;
  uVar10 = 0;
  if (top->format_name != (char *)0x0) {
    p_Var3 = top + 1;
    uVar10 = 0;
    do {
      uVar10 = uVar10 + 1;
      ppcVar2 = &p_Var3->format_name;
      p_Var3 = p_Var3 + 1;
    } while (*ppcVar2 != (char *)0x0);
  }
  if (cp != (FMStructDescList)0x0) {
    uVar9 = 0;
    p_Var3 = cp;
    do {
      if (p_Var3->format_name == (char *)0x0) break;
      uVar9 = uVar9 + 1;
      p_Var3 = p_Var3 + 1;
    } while (cp != (FMStructDescList)0x0);
  }
  uVar7 = 0;
  for (p_Var3 = dp; (dp != (FMStructDescList)0x0 && (p_Var3->format_name != (char *)0x0));
      p_Var3 = p_Var3 + 1) {
    uVar7 = uVar7 + 1;
  }
  uVar1 = uVar9 + uVar10;
  uVar8 = (ulong)(uVar1 + uVar7);
  p_Var3 = (FMStructDescList)realloc(__ptr,uVar8 * 0x20 + 0x20);
  if (uVar9 != 0) {
    lVar11 = 0;
    do {
      pcVar4 = strdup(*(char **)((long)&cp->format_name + lVar11));
      *(char **)((long)&p_Var3[uVar10].format_name + lVar11) = pcVar4;
      uVar5 = copy_field_list(*(undefined8 *)((long)&cp->field_list + lVar11));
      *(undefined8 *)((long)&p_Var3[uVar10].field_list + lVar11) = uVar5;
      *(undefined4 *)((long)&p_Var3[uVar10].struct_size + lVar11) =
           *(undefined4 *)((long)&cp->struct_size + lVar11);
      *(undefined8 *)((long)&p_Var3[uVar10].opt_info + lVar11) = 0;
      lVar11 = lVar11 + 0x20;
    } while ((ulong)uVar9 << 5 != lVar11);
  }
  if (uVar7 != 0) {
    lVar11 = 0;
    do {
      pcVar4 = strdup(*(char **)((long)&dp->format_name + lVar11));
      *(char **)((long)&p_Var3[uVar1].format_name + lVar11) = pcVar4;
      uVar5 = copy_field_list(*(undefined8 *)((long)&dp->field_list + lVar11));
      *(undefined8 *)((long)&p_Var3[uVar1].field_list + lVar11) = uVar5;
      *(undefined4 *)((long)&p_Var3[uVar1].struct_size + lVar11) =
           *(undefined4 *)((long)&dp->struct_size + lVar11);
      *(undefined8 *)((long)&p_Var3[uVar1].opt_info + lVar11) = 0;
      lVar11 = lVar11 + 0x20;
    } while ((ulong)uVar7 << 5 != lVar11);
  }
  iVar6 = 0;
  p_Var3[uVar8].opt_info = (FMOptInfo *)0x0;
  p_Var3[uVar8].format_name = (char *)0x0;
  p_Var3[uVar8].field_list = (FMFieldList)0x0;
  p_Var3[uVar8].struct_size = 0;
  if (cp == (FMStructDescList)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    pcVar4 = cp->format_name;
    iVar6 = cp->struct_size;
  }
  replaceFormatNameInFieldList(p_Var3,"CP_STRUCT",pcVar4,iVar6);
  iVar6 = 0;
  if (dp == (FMStructDescList)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    pcVar4 = dp->format_name;
    iVar6 = dp->struct_size;
  }
  replaceFormatNameInFieldList(p_Var3,"DP_STRUCT",pcVar4,iVar6);
  return p_Var3;
}

Assistant:

static FMStructDescList combineCpDpFormats(FMStructDescList top, FMStructDescList cp,
                                           FMStructDescList dp)
{
    int i = 0, topCount = 0, cpCount = 0, dpCount = 0;
    FMStructDescList CombinedFormats = FMcopy_struct_list(top);

    i = 0;
    while (top[i++].format_name)
        topCount++;

    i = 0;
    while (cp && cp[i++].format_name)
        cpCount++;

    i = 0;
    while (dp && dp[i++].format_name)
        dpCount++;

    CombinedFormats =
        realloc(CombinedFormats, sizeof(CombinedFormats[0]) * (topCount + cpCount + dpCount + 1));
    for (i = 0; i < cpCount; i++)
    {
        CombinedFormats[topCount + i].format_name = strdup(cp[i].format_name);
        CombinedFormats[topCount + i].field_list = copy_field_list(cp[i].field_list);
        CombinedFormats[topCount + i].struct_size = cp[i].struct_size;
        CombinedFormats[topCount + i].opt_info = NULL;
    }

    for (i = 0; i < dpCount; i++)
    {
        CombinedFormats[topCount + cpCount + i].format_name = strdup(dp[i].format_name);
        CombinedFormats[topCount + cpCount + i].field_list = copy_field_list(dp[i].field_list);
        CombinedFormats[topCount + cpCount + i].struct_size = dp[i].struct_size;
        CombinedFormats[topCount + cpCount + i].opt_info = NULL;
    }
    CombinedFormats[topCount + cpCount + dpCount].format_name = NULL;
    CombinedFormats[topCount + cpCount + dpCount].field_list = NULL;
    CombinedFormats[topCount + cpCount + dpCount].struct_size = 0;
    CombinedFormats[topCount + cpCount + dpCount].opt_info = NULL;

    replaceFormatNameInFieldList(CombinedFormats, "CP_STRUCT", cp ? cp[0].format_name : NULL,
                                 cp ? cp[0].struct_size : 0);
    replaceFormatNameInFieldList(CombinedFormats, "DP_STRUCT", dp ? dp[0].format_name : NULL,
                                 dp ? dp[0].struct_size : 0);
    return CombinedFormats;
}